

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O1

long yyyymmdd(time_t date)

{
  uint uVar1;
  tm *ptVar2;
  long lVar3;
  long in_RDI;
  time_t local_8;
  
  if (in_RDI == 0) {
    ptVar2 = (tm *)getlt();
  }
  else {
    ptVar2 = localtime(&local_8);
  }
  uVar1 = ptVar2->tm_year;
  lVar3 = (ulong)uVar1 + 0x76c;
  if ((long)(int)uVar1 < 0x46) {
    lVar3 = (long)(int)uVar1 + 2000;
  }
  return (long)ptVar2->tm_mday + ((long)ptVar2->tm_mon + lVar3 * 100) * 100 + 100;
}

Assistant:

long yyyymmdd(time_t date)
{
	long datenum;
	struct tm *lt;

	if (date == 0)
		lt = getlt();
	else
		lt = localtime(&date);

	/* just in case somebody's localtime supplies (year % 100)
	   rather than the expected (year - 1900) */
	if (lt->tm_year < 70)
	    datenum = (long)lt->tm_year + 2000L;
	else
	    datenum = (long)lt->tm_year + 1900L;
	/* yyyy --> yyyymm */
	datenum = datenum * 100L + (long)(lt->tm_mon + 1);
	/* yyyymm --> yyyymmdd */
	datenum = datenum * 100L + (long)lt->tm_mday;
	return datenum;
}